

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O0

void __thiscall cppnet::Thread::Start(Thread *this)

{
  bool bVar1;
  thread *this_00;
  Thread *local_48;
  offset_in_Thread_to_subr local_40 [2];
  type local_30;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> local_18;
  Thread *local_10;
  Thread *this_local;
  
  local_10 = this;
  std::atomic<bool>::operator=(&this->_stop,false);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->_thread);
  if (!bVar1) {
    this_00 = (thread *)operator_new(8);
    local_40[1] = 0;
    local_40[0] = 0x29;
    local_48 = this;
    std::bind<void(cppnet::Thread::*)(),cppnet::Thread*>(&local_30,local_40,&local_48);
    std::thread::thread<std::_Bind<void(cppnet::Thread::*(cppnet::Thread*))()>,,void>
              (this_00,&local_30);
    std::unique_ptr<std::thread,std::default_delete<std::thread>>::
    unique_ptr<std::default_delete<std::thread>,void>
              ((unique_ptr<std::thread,std::default_delete<std::thread>> *)&local_18,this_00);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
              (&this->_thread,&local_18);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&local_18);
  }
  return;
}

Assistant:

virtual void Start() {
        _stop = false;
        if (!_thread) {
            _thread = std::unique_ptr<std::thread>(new std::thread(std::bind(&Thread::Run, this)));
        }
    }